

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall cmCTestCoverageHandler::IsFilteredOut(cmCTestCoverageHandler *this,string *source)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_60 [3];
  _Self local_48;
  iterator li;
  string shortSrc;
  string *source_local;
  cmCTestCoverageHandler *this_local;
  
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(&this->LabelFilter);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    cmCTest::GetShortPathToFile((string *)&li,(this->super_cmCTestGenericHandler).CTest,source);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
         ::find(&this->SourceLabels,(string *)&li);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
         ::end(&this->SourceLabels);
    bVar1 = std::operator!=(&local_48,local_60);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>
               ::operator->(&local_48);
      bVar1 = IntersectsFilter(this,&ppVar2->second);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      this_local._7_1_ = true;
    }
    std::__cxx11::string::~string((string *)&li);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageHandler::IsFilteredOut(std::string const& source)
{
  // If there is no label filter then nothing is filtered out.
  if (this->LabelFilter.empty()) {
    return false;
  }

  // The source is filtered out if it does not have any labels in
  // common with the filter set.
  std::string shortSrc = this->CTest->GetShortPathToFile(source);
  auto li = this->SourceLabels.find(shortSrc);
  if (li != this->SourceLabels.end()) {
    return !this->IntersectsFilter(li->second);
  }
  return true;
}